

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_flatten_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  int *piVar5;
  bool bVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar8 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_38 = 1;
  uVar7 = 0;
  do {
    if (uVar7 == uVar8) {
      return 0;
    }
    bVar6 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar7]->type,"Pooling");
    if ((!bVar6) &&
       (pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar7],
       *(int *)((long)&pLVar3[1].userdata + 4) != 0)) {
      iVar1 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = local_38; uVar9 < uVar8; uVar9 = uVar9 + 1) {
        bVar6 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"Flatten");
        if (((!bVar6) &&
            (pLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar9],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar5 == 4)) && (*piVar5 == iVar1)) {
          if (uVar8 != uVar9) {
            pLVar4 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            fprintf(_stderr,"eliminate_flatten_after_global_pooling %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p,(pLVar4->name)._M_dataplus._M_p);
            iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1].producer = (int)uVar7;
            std::__cxx11::string::assign((char *)&pLVar4->type);
          }
          break;
        }
      }
    }
    uVar7 = uVar7 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_flatten_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Flatten
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_global_pooling %s %s\n", pooling->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}